

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

FT_Error t1_builder_add_contour(T1_Builder builder)

{
  FT_Outline *pFVar1;
  FT_GlyphLoader loader;
  short sVar2;
  FT_Error FVar3;
  
  pFVar1 = builder->current;
  if (pFVar1 == (FT_Outline *)0x0) {
    return 3;
  }
  if (builder->load_points != '\0') {
    loader = builder->loader;
    if ((loader->max_contours <
         (int)(loader->base).outline.n_contours + (int)(loader->current).outline.n_contours + 1U) &&
       (FVar3 = FT_GlyphLoader_CheckPoints(loader,0,1), FVar3 != 0)) {
      return FVar3;
    }
    sVar2 = pFVar1->n_contours;
    if (sVar2 < 1) goto LAB_002053ae;
    pFVar1->contours[(int)sVar2 - 1] = pFVar1->n_points + -1;
  }
  sVar2 = pFVar1->n_contours;
LAB_002053ae:
  pFVar1->n_contours = sVar2 + 1;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  t1_builder_add_contour( T1_Builder  builder )
  {
    FT_Outline*  outline = builder->current;
    FT_Error     error;


    /* this might happen in invalid fonts */
    if ( !outline )
    {
      FT_ERROR(( "t1_builder_add_contour: no outline to add points to\n" ));
      return FT_THROW( Invalid_File_Format );
    }

    if ( !builder->load_points )
    {
      outline->n_contours++;
      return FT_Err_Ok;
    }

    error = FT_GLYPHLOADER_CHECK_POINTS( builder->loader, 0, 1 );
    if ( !error )
    {
      if ( outline->n_contours > 0 )
        outline->contours[outline->n_contours - 1] =
          (short)( outline->n_points - 1 );

      outline->n_contours++;
    }

    return error;
  }